

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

void duckdb::MedianAbsoluteDeviationOperation<int>::
     Finalize<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,int *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  int *v_t;
  int iVar2;
  reference pvVar3;
  idx_t iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  MadAccessor<int,_int,_int> accessor;
  int med;
  Interpolator<false> interp;
  MadAccessor<int,_int,_int> local_88;
  int local_7c;
  double local_78;
  double dStack_70;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pvVar3 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)((this->bind_data).ptr + 1),0);
    v_t = (state->v).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (long)(state->v).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)v_t >> 2;
    local_60.desc = false;
    lVar1 = iVar4 - 1;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    dStack_70 = auVar6._8_8_ - 1.9342813113834067e+25;
    local_78 = (dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar3->dbl;
    local_60.RN = local_78;
    dVar5 = floor(local_78);
    local_60.FRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    dVar5 = ceil(local_78);
    local_60.CRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    local_60.begin = 0;
    local_60.end = iVar4;
    local_7c = Interpolator<false>::Operation<int,int,duckdb::QuantileDirect<int>>
                         (&local_60,v_t,finalize_data->result,(QuantileDirect<int> *)&local_88);
    local_88.median = &local_7c;
    iVar2 = Interpolator<false>::Operation<int,int,duckdb::MadAccessor<int,int,int>>
                      (&local_60,
                       (state->v).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start,finalize_data->result,&local_88);
    *target = iVar2;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}